

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.cc
# Opt level: O0

string * __thiscall
bssl::PEMEncode(string *__return_storage_ptr__,bssl *this,string_view data,string *type)

{
  long lVar1;
  ulong local_78;
  size_t chunk_offset;
  size_t i;
  size_t chunks;
  undefined1 local_48 [8];
  string b64_encoded;
  string *type_local;
  string_view data_local;
  string *pem_encoded;
  
  b64_encoded.field_2._8_8_ = data._M_str;
  data_local._M_len = data._M_len;
  type_local = (string *)this;
  data_local._M_str = (char *)__return_storage_ptr__;
  ::std::__cxx11::string::string((string *)local_48);
  string_util::Base64Encode((string_view *)&type_local,(string *)local_48);
  lVar1 = ::std::__cxx11::string::size();
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  ::std::__cxx11::string::size();
  ::std::__cxx11::string::size();
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  ::std::__cxx11::string::operator=
            ((string *)__return_storage_ptr__,
             (basic_string_view<char,_std::char_traits<char>_> *)
             &::(anonymous_namespace)::kPEMHeaderBeginBlock);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)__return_storage_ptr__,
             (basic_string_view<char,_std::char_traits<char>_> *)
             ::(anonymous_namespace)::kPEMHeaderTail);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_78 = 0;
  for (chunk_offset = 0; chunk_offset < lVar1 + 0x3fU >> 6; chunk_offset = chunk_offset + 1) {
    ::std::__cxx11::string::append((string *)__return_storage_ptr__,(ulong)local_48,local_78);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    local_78 = local_78 + 0x40;
  }
  ::std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)__return_storage_ptr__,
             (basic_string_view<char,_std::char_traits<char>_> *)
             ::(anonymous_namespace)::kPEMHeaderEndBlock);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)__return_storage_ptr__,
             (basic_string_view<char,_std::char_traits<char>_> *)
             ::(anonymous_namespace)::kPEMHeaderTail);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string PEMEncode(std::string_view data, const std::string &type) {
  std::string b64_encoded;
  string_util::Base64Encode(data, &b64_encoded);

  // Divide the Base-64 encoded data into 64-character chunks, as per
  // 4.3.2.4 of RFC 1421.
  static const size_t kChunkSize = 64;
  size_t chunks = (b64_encoded.size() + (kChunkSize - 1)) / kChunkSize;

  std::string pem_encoded;
  pem_encoded.reserve(
      // header & footer
      17 + 15 + type.size() * 2 +
      // encoded data
      b64_encoded.size() +
      // newline characters for line wrapping in encoded data
      chunks);

  pem_encoded = kPEMHeaderBeginBlock;
  pem_encoded.append(type);
  pem_encoded.append(kPEMHeaderTail);
  pem_encoded.append("\n");

  for (size_t i = 0, chunk_offset = 0; i < chunks;
       ++i, chunk_offset += kChunkSize) {
    pem_encoded.append(b64_encoded, chunk_offset, kChunkSize);
    pem_encoded.append("\n");
  }

  pem_encoded.append(kPEMHeaderEndBlock);
  pem_encoded.append(type);
  pem_encoded.append(kPEMHeaderTail);
  pem_encoded.append("\n");
  return pem_encoded;
}